

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O1

int AF_A_KoraxCommand(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *ent;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  PClassActor *type;
  char *__assertion;
  bool bVar9;
  DVector3 pos;
  FSoundID local_50;
  FName local_4c;
  DAngle local_48;
  DVector3 local_40;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bd11e;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    ent = (AActor *)(param->field_0).field_1.a;
    if (ent != (AActor *)0x0) {
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar8 = (ent->super_DThinker).super_DObject.Class;
      bVar9 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar3 && bVar9) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar9 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar9) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005bd11e;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005bd0f3;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar9 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar3 && bVar9) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar9 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar3) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005bd11e;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_50.ID = S_FindSound("KoraxCommand");
      S_Sound(ent,2,&local_50,1.0,1.0);
      local_48.Degrees = (ent->Angles).Yaw.Degrees + -90.0;
      AActor::Vec3Angle(&local_40,ent,27.0,&local_48,120.0,false);
      local_4c.Index = FName::NameManager::FindName(&FName::NameData,"KoraxBolt",false);
      type = ClassForSpawn(&local_4c);
      AActor::StaticSpawn(type,&local_40,ALLOW_REPLACE,false);
      iVar4 = ent->health;
      iVar5 = AActor::SpawnHealth(ent);
      uVar6 = FRandom::GenRand32(&pr_koraxcommand);
      P_StartScript(ent,(line_t *)0x0,(uVar6 & 0xff) % (iVar5 >> 1 < iVar4 ^ 5) + 0xfa,(char *)0x0,
                    (int *)0x0,0,0);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005bd0f3:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005bd11e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                ,0x10c,"int AF_A_KoraxCommand(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxCommand)
{
	PARAM_ACTION_PROLOGUE;
	DAngle ang;
	int numcommands;

	S_Sound (self, CHAN_VOICE, "KoraxCommand", 1, ATTN_NORM);

	// Shoot stream of lightning to ceiling
	ang = self->Angles.Yaw - 90;
	DVector3 pos = self->Vec3Angle(KORAX_COMMAND_OFFSET, ang, KORAX_COMMAND_HEIGHT);
	Spawn("KoraxBolt", pos, ALLOW_REPLACE);

	if (self->health <= (self->SpawnHealth() >> 1))
	{
		numcommands = 5;
	}
	else
	{
		numcommands = 4;
	}

	P_StartScript (self, NULL, 250+(pr_koraxcommand()%numcommands), NULL, NULL, 0, 0);
	return 0;
}